

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

SQNativeClosure * __thiscall SQNativeClosure::Clone(SQNativeClosure *this)

{
  SQNativeClosure *this_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  SQFUNCTION in_RDI;
  SQSharedState *unaff_retaddr;
  SQInteger _n_;
  SQNativeClosure *ret;
  SQObjectPtr *in_stack_ffffffffffffffe8;
  byte *obj;
  SQInteger in_stack_fffffffffffffff0;
  
  this_00 = Create(unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
  this_00->_env = *(SQWeakRef **)(in_RDI + 0x60);
  if (this_00->_env != (SQWeakRef *)0x0) {
    (this_00->_env->super_SQRefCounted)._uiRef = (this_00->_env->super_SQRefCounted)._uiRef + 1;
  }
  ::SQObjectPtr::operator=((SQObjectPtr *)this_00,in_stack_ffffffffffffffe8);
  src = extraout_RDX;
  for (obj = (byte *)0x0; (long)obj < *(long *)(in_RDI + 0x58);
      obj = (byte *)((long)&(((SQObjectPtr *)obj)->super_SQObject)._type + 1)) {
    ::SQObjectPtr::operator=((SQObjectPtr *)this_00,(SQObjectPtr *)obj);
    src = extraout_RDX_00;
  }
  sqvector<long_long>::copy(&this_00->_typecheck,(EVP_PKEY_CTX *)(in_RDI + 0x38),src);
  this_00->_nparamscheck = *(SQInteger *)(in_RDI + 0x30);
  return this_00;
}

Assistant:

SQNativeClosure *Clone()
    {
        SQNativeClosure * ret = SQNativeClosure::Create(_opt_ss(this),_function,_noutervalues);
        ret->_env = _env;
        if(ret->_env) __ObjAddRef(ret->_env);
        ret->_name = _name;
        _COPY_VECTOR(ret->_outervalues,_outervalues,_noutervalues);
        ret->_typecheck.copy(_typecheck);
        ret->_nparamscheck = _nparamscheck;
        return ret;
    }